

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O3

IOTHUB_DEVICE_HANDLE * get_perDeviceDataItem(IOTHUB_DEVICE_HANDLE deviceHandle)

{
  IOTHUB_DEVICE_HANDLE *ppvVar1;
  LOGGER_LOG p_Var2;
  
  ppvVar1 = (IOTHUB_DEVICE_HANDLE *)
            VECTOR_find_if(*(VECTOR_HANDLE *)(*deviceHandle + 0x18),findDeviceHandle,deviceHandle);
  if (ppvVar1 == (IOTHUB_DEVICE_HANDLE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"get_perDeviceDataItem",0x340,1,"device handle not found in transport device list")
      ;
    }
  }
  return ppvVar1;
}

Assistant:

static IOTHUB_DEVICE_HANDLE* get_perDeviceDataItem(IOTHUB_DEVICE_HANDLE deviceHandle)
{
    HTTPTRANSPORT_PERDEVICE_DATA* deviceHandleData = (HTTPTRANSPORT_PERDEVICE_DATA*)deviceHandle;
    IOTHUB_DEVICE_HANDLE* listItem;

    HTTPTRANSPORT_HANDLE_DATA* handleData = deviceHandleData->transportHandle;

    listItem = (IOTHUB_DEVICE_HANDLE *)VECTOR_find_if(handleData->perDeviceList, findDeviceHandle, deviceHandle);
    if (listItem == NULL)
    {
        LogError("device handle not found in transport device list");
        listItem = NULL;
    }
    else
    {
        /* sucessfully found device in list. */
    }

    return listItem;
}